

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_posix.c
# Opt level: O0

int os_open(char *pathname,int flags,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  ulong uVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined4 local_38;
  int mode;
  va_list arg;
  int mode_required;
  int flags_local;
  char *pathname_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  arg[0].reg_save_area._0_4_ = (uint)((flags & 0x410000U) == 0x410000 || (flags & 0x40U) == 0x40);
  local_e8 = in_RDX;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  arg[0].reg_save_area._4_4_ = flags;
  if ((uint)arg[0].reg_save_area == 0) {
    pathname_local._4_4_ = open(pathname,flags);
  }
  else {
    arg[0].overflow_arg_area = local_f8;
    arg[0]._0_8_ = &stack0x00000008;
    mode = 0x30;
    local_38 = 0x18;
    uVar1 = (ulong)(uint)local_e8;
    pathname_local._4_4_ = open(pathname,flags,uVar1);
  }
  return pathname_local._4_4_;
}

Assistant:

int
os_open(const char *pathname, int flags, ...)
{
	int mode_required = (flags & O_CREAT) == O_CREAT;

#ifdef O_TMPFILE
	mode_required |= (flags & O_TMPFILE) == O_TMPFILE;
#endif

	if (mode_required) {
		va_list arg;
		va_start(arg, flags);
		/* Clang requires int due to auto-promotion */
		int mode = va_arg(arg, int);
		va_end(arg);
		return open(pathname, flags, (mode_t)mode);
	} else {
		return open(pathname, flags);
	}
}